

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

SoapySDRArgInfo *
SoapySDRDevice_getChannelSettingInfoWithKey
          (SoapySDRArgInfo *__return_storage_ptr__,SoapySDRDevice *device,int direction,
          size_t channel,char *key)

{
  SoapySDRArgInfo *pSVar1;
  undefined1 *puVar2;
  allocator local_149;
  SoapySDRArgInfo *local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  ArgInfo local_120;
  
  local_148 = __return_storage_ptr__;
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_140,key,&local_149);
  (**(code **)(*(long *)device + 0x348))(&local_120,device,direction,channel,local_140);
  pSVar1 = local_148;
  toArgInfo(local_148,&local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120.optionNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120.options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.units._M_dataplus._M_p != &local_120.units.field_2) {
    operator_delete(local_120.units._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.description._M_dataplus._M_p != &local_120.description.field_2) {
    operator_delete(local_120.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.name._M_dataplus._M_p != &local_120.name.field_2) {
    operator_delete(local_120.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.value._M_dataplus._M_p != &local_120.value.field_2) {
    operator_delete(local_120.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.key._M_dataplus._M_p != &local_120.key.field_2) {
    operator_delete(local_120.key._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  return pSVar1;
}

Assistant:

SoapySDRArgInfo SoapySDRDevice_getChannelSettingInfoWithKey(const SoapySDRDevice *device, const int direction, const size_t channel, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toArgInfo(device->getSettingInfo(direction, channel, key));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRArgInfo())
}